

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::testBadWebSocketHandshake::ErrorHandler::ErrorHandler(ErrorHandler *this)

{
  ErrorHandler *this_local;
  
  HttpServerErrorHandler::HttpServerErrorHandler(&this->super_HttpServerErrorHandler);
  (this->super_HttpServerErrorHandler)._vptr_HttpServerErrorHandler =
       (_func_int **)&PTR_handleClientProtocolError_00c022b8;
  return;
}

Assistant:

Promise<void> handleApplicationError(
        Exception exception, Maybe<HttpService::Response&> response) override {
      // When I first wrote this, I expected this function to be called, because
      // `TestWebSocketService::request()` definitely throws. However, the exception it throws comes
      // from `HttpService::Response::acceptWebSocket()`, which stores the fact which it threw a
      // WebSocket error. This prevents the HttpServer's listen loop from propagating the exception
      // to our HttpServerErrorHandler (i.e., this function), because it assumes the exception is
      // related to the WebSocket error response. See `HttpServer::Connection::startLoop()` for
      // details.
      bool responseWasSent = response == kj::none;
      KJ_FAIL_EXPECT("Unexpected application error", responseWasSent, exception);
      return READY_NOW;
    }